

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::StringifyMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,Message *message,Option option,
          FieldReporterLevel reporter_level)

{
  int iVar1;
  FieldReporterLevel reporter;
  undefined1 local_98 [8];
  Printer printer;
  ScopedReflectionMode scope;
  FieldReporterLevel reporter_level_local;
  Option option_local;
  Message *message_local;
  string *result;
  
  iVar1 = (int)message;
  ScopedReflectionMode::ScopedReflectionMode
            ((ScopedReflectionMode *)((long)&printer.finder_ + 4),kDebugString);
  TextFormat::Printer::Printer((Printer *)local_98);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      TextFormat::Printer::SetSingleLineMode((Printer *)local_98,true);
    }
    else if (iVar1 == 2) {
      TextFormat::Printer::SetUseUtf8StringEscaping((Printer *)local_98,true);
    }
  }
  TextFormat::Printer::SetExpandAny((Printer *)local_98,true);
  TextFormat::Printer::SetRedactDebugString((Printer *)local_98,true);
  TextFormat::Printer::SetRandomizeDebugString((Printer *)local_98,true);
  TextFormat::Printer::SetReportSensitiveFields((Printer *)local_98,option);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::Printer::PrintToString((Printer *)local_98,(Message *)this,__return_storage_ptr__);
  if (iVar1 == 1) {
    anon_unknown_14::TrimTrailingSpace(__return_storage_ptr__);
  }
  TextFormat::Printer::~Printer((Printer *)local_98);
  ScopedReflectionMode::~ScopedReflectionMode((ScopedReflectionMode *)((long)&printer.finder_ + 4));
  return __return_storage_ptr__;
}

Assistant:

std::string StringifyMessage(const Message& message, Option option,
                             FieldReporterLevel reporter_level) {
  // Indicate all scoped reflection calls are from DebugString function.
  ScopedReflectionMode scope(ReflectionMode::kDebugString);

  TextFormat::Printer printer;
  internal::FieldReporterLevel reporter = reporter_level;
  switch (option) {
    case Option::kShort:
      printer.SetSingleLineMode(true);
      break;
    case Option::kUTF8:
      printer.SetUseUtf8StringEscaping(true);
      break;
    case Option::kNone:
      break;
  }
  printer.SetExpandAny(true);
  printer.SetRedactDebugString(true);
  printer.SetRandomizeDebugString(true);
  printer.SetReportSensitiveFields(reporter);
  std::string result;
  printer.PrintToString(message, &result);

  if (option == Option::kShort) {
    TrimTrailingSpace(result);
  }

  return result;
}